

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O1

void Abc_NtkVerifyReportError(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int *pModel)

{
  int *piVar1;
  int *__ptr;
  int *__ptr_00;
  Vec_Ptr_t *pVVar2;
  char *pcVar3;
  Vec_Ptr_t *__ptr_01;
  Abc_Obj_t *pAVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  Abc_Obj_t *pNode;
  Abc_Obj_t *local_40;
  int *local_38;
  
  if (pNtk1->vCis->nSize != pNtk2->vCis->nSize) {
    __assert_fail("Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcVerify.c"
                  ,0x2e7,"void Abc_NtkVerifyReportError(Abc_Ntk_t *, Abc_Ntk_t *, int *)");
  }
  if (pNtk1->vCos->nSize != pNtk2->vCos->nSize) {
    __assert_fail("Abc_NtkCoNum(pNtk1) == Abc_NtkCoNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcVerify.c"
                  ,0x2e8,"void Abc_NtkVerifyReportError(Abc_Ntk_t *, Abc_Ntk_t *, int *)");
  }
  __ptr = Abc_NtkVerifySimulatePattern(pNtk1,pModel);
  __ptr_00 = Abc_NtkVerifySimulatePattern(pNtk2,pModel);
  lVar7 = (long)pNtk1->vCos->nSize;
  uVar8 = 0;
  uVar6 = 0;
  if (0 < lVar7) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 + (__ptr[lVar5] != __ptr_00[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar7 != lVar5);
  }
  local_38 = pModel;
  printf("Verification failed for at least %d outputs: ",(ulong)uVar6);
  pVVar2 = pNtk1->vCos;
  if (pVVar2->nSize < 1) {
    uVar9 = 0xffffffff;
  }
  else {
    uVar9 = 0xffffffff;
    lVar7 = 0;
    uVar8 = 0;
    do {
      if (__ptr[lVar7] != __ptr_00[lVar7]) {
        if (uVar9 == 0xffffffff) {
          uVar9 = (uint)lVar7;
        }
        pcVar3 = Abc_ObjName((Abc_Obj_t *)pVVar2->pArray[lVar7]);
        printf(" %s",pcVar3);
        uVar8 = uVar8 + 1;
        if (uVar8 == 3) {
          uVar8 = 3;
          break;
        }
      }
      lVar7 = lVar7 + 1;
      pVVar2 = pNtk1->vCos;
    } while (lVar7 < pVVar2->nSize);
  }
  if (uVar8 != uVar6) {
    printf(" ...");
  }
  putchar(10);
  if ((int)uVar9 < 0) {
LAB_002b733f:
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    if (__ptr_00 != (int *)0x0) {
      free(__ptr_00);
    }
    return;
  }
  if ((int)uVar9 < pNtk1->vCos->nSize) {
    pcVar3 = Abc_ObjName((Abc_Obj_t *)pNtk1->vCos->pArray[uVar9]);
    printf("Output %s: Value in Network1 = %d. Value in Network2 = %d.\n",pcVar3,
           (ulong)(uint)__ptr[uVar9],(ulong)(uint)__ptr_00[uVar9]);
    printf("Input pattern: ");
    if ((int)uVar9 < pNtk1->vCos->nSize) {
      local_40 = (Abc_Obj_t *)pNtk1->vCos->pArray[uVar9];
      __ptr_01 = Abc_NtkNodeSupport(pNtk1,&local_40,1);
      piVar1 = local_38;
      pVVar2 = pNtk1->vCis;
      if (0 < pVVar2->nSize) {
        pAVar4 = (Abc_Obj_t *)0x0;
        do {
          local_40 = (Abc_Obj_t *)pVVar2->pArray[(long)pAVar4];
          (local_40->field_6).pCopy = pAVar4;
          pAVar4 = (Abc_Obj_t *)((long)&pAVar4->pNtk + 1);
          pVVar2 = pNtk1->vCis;
        } while ((long)pAVar4 < (long)pVVar2->nSize);
      }
      if (0 < __ptr_01->nSize) {
        local_40 = (Abc_Obj_t *)*__ptr_01->pArray;
        uVar6 = *(uint *)&local_40->field_0x14 & 0xf;
        if (((uVar6 == 5) || (uVar6 == 2)) && (0 < __ptr_01->nSize)) {
          lVar7 = 0;
          do {
            local_40 = (Abc_Obj_t *)__ptr_01->pArray[lVar7];
            uVar6 = *(uint *)&local_40->field_0x14 & 0xf;
            if ((uVar6 != 2) && (uVar6 != 5)) {
              __assert_fail("Abc_ObjIsCi(pNode)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcVerify.c"
                            ,0x311,"void Abc_NtkVerifyReportError(Abc_Ntk_t *, Abc_Ntk_t *, int *)")
              ;
            }
            pcVar3 = Abc_ObjName(local_40);
            printf(" %s=%d",pcVar3,(ulong)(uint)piVar1[(local_40->field_6).iTemp]);
            lVar7 = lVar7 + 1;
          } while (lVar7 < __ptr_01->nSize);
        }
        putchar(10);
        if (__ptr_01->pArray != (void **)0x0) {
          free(__ptr_01->pArray);
          __ptr_01->pArray = (void **)0x0;
        }
        if (__ptr_01 != (Vec_Ptr_t *)0x0) {
          free(__ptr_01);
        }
        goto LAB_002b733f;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Abc_NtkVerifyReportError( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int * pModel, Vec_Int_t * mismatch )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;    
    int nErrors, nPrinted, i, iNode = -1;

    assert( Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2) );
    assert( Abc_NtkCoNum(pNtk1) == Abc_NtkCoNum(pNtk2) );
    // get the CO values under this model
    pValues1__ = Abc_NtkVerifySimulatePattern( pNtk1, pModel );
    pValues2__ = Abc_NtkVerifySimulatePattern( pNtk2, pModel );
    // count the mismatches
    nErrors = 0;
    for ( i = 0; i < Abc_NtkCoNum(pNtk1); i++ )
        nErrors += (int)( pValues1__[i] != pValues2__[i] );
    //printf( "Verification failed for at least %d outputs: ", nErrors );
    // print the first 3 outputs
    nPrinted = 0;
    for ( i = 0; i < Abc_NtkCoNum(pNtk1); i++ )
        if ( pValues1__[i] != pValues2__[i] )
        {
            if ( iNode == -1 )
                iNode = i;
            //printf( " %s", Abc_ObjName(Abc_NtkCo(pNtk1,i)) );
            if ( ++nPrinted == 3 )
                break;
        }
    /*if ( nPrinted != nErrors )
        printf( " ..." );
    printf( "\n" );*/
    // report mismatch for the first output
    if ( iNode >= 0 )
    {
        /*printf( "Output %s: Value in Network1 = %d. Value in Network2 = %d.\n", 
            Abc_ObjName(Abc_NtkCo(pNtk1,iNode)), pValues1[iNode], pValues2[iNode] );
        printf( "Input pattern: " );*/
        // collect PIs in the cone
        pNode = Abc_NtkCo(pNtk1,iNode);
        vNodes = Abc_NtkNodeSupport( pNtk1, &pNode, 1 );
        // set the PI numbers
        Abc_NtkForEachCi( pNtk1, pNode, i )
            pNode->iTemp = i;
        // print the model
        pNode = (Abc_Obj_t *)Vec_PtrEntry( vNodes, 0 );
        if ( Abc_ObjIsCi(pNode) )
        {
            Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
            {
                assert( Abc_ObjIsCi(pNode) );
                //printf( " %s=%d", Abc_ObjName(pNode), pModel[(int)pNode->pCopy] );
				Vec_IntPush(mismatch, Abc_ObjId(pNode)-1);
				Vec_IntPush(mismatch, pModel[(int)(size_t)pNode->pCopy]);
            }
        }
        //printf( "\n" );
        Vec_PtrFree( vNodes );
    }
    free( pValues1__ );
    free( pValues2__ );
}